

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O2

int WebRtcAgc_get_config(void *agcInst,WebRtcAgcConfig *config)

{
  undefined4 uVar1;
  int iVar2;
  
  iVar2 = -1;
  if (agcInst != (void *)0x0) {
    if (config == (WebRtcAgcConfig *)0x0) {
      *(undefined2 *)((long)agcInst + 0x1a) = 0x4653;
      return iVar2;
    }
    if (*(short *)((long)agcInst + 0x18) != 0x2a) {
      *(undefined2 *)((long)agcInst + 0x1a) = 0x4652;
      return iVar2;
    }
    config->limiterEnable = *(uint8_t *)((long)agcInst + 0x16);
    uVar1 = *(undefined4 *)((long)agcInst + 0x12);
    config->targetLevelDbfs = (short)uVar1;
    config->compressionGaindB = (short)((uint)uVar1 >> 0x10);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int WebRtcAgc_get_config(void *agcInst, WebRtcAgcConfig *config) {
    LegacyAgc *stt;
    stt = (LegacyAgc *) agcInst;

    if (stt == NULL) {
        return -1;
    }

    if (config == NULL) {
        stt->lastError = AGC_NULL_POINTER_ERROR;
        return -1;
    }

    if (stt->initFlag != kInitCheck) {
        stt->lastError = AGC_UNINITIALIZED_ERROR;
        return -1;
    }

    config->limiterEnable = stt->usedConfig.limiterEnable;
    config->targetLevelDbfs = stt->usedConfig.targetLevelDbfs;
    config->compressionGaindB = stt->usedConfig.compressionGaindB;

    return 0;
}